

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDiffReporter.cpp
# Opt level: O2

void __thiscall
ApprovalTests::GenericDiffReporter::GenericDiffReporter(GenericDiffReporter *this,DiffInfo *info)

{
  string sStack_58;
  string local_38;
  
  (this->super_CommandReporter).super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__GenericDiffReporter_001a1c88;
  DiffInfo::getProgramForOs_abi_cxx11_(&local_38,info);
  ::std::__cxx11::string::string((string *)&sStack_58,(string *)&info->arguments);
  CommandReporter::CommandReporter
            (&this->super_CommandReporter,&local_38,&sStack_58,
             &(this->launcher).super_CommandLauncher);
  ::std::__cxx11::string::~string((string *)&sStack_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  (this->super_CommandReporter).super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__GenericDiffReporter_001a1c88;
  SystemLauncher::SystemLauncher(&this->launcher,false,false);
  return;
}

Assistant:

GenericDiffReporter::GenericDiffReporter(const DiffInfo& info)
        : CommandReporter(info.getProgramForOs(), info.arguments, &launcher)
    {
    }